

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O2

void adjust_heap(uint64_t **first,size_t holeIndex,size_t len,uint64_t *value)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t holeIndex_00;
  ulong uVar4;
  ulong uVar5;
  
  holeIndex_00 = holeIndex;
  while (holeIndex_00 < len - 1 >> 1) {
    uVar1 = holeIndex_00 * 2 + 2;
    uVar4 = holeIndex_00 * 2 + 1;
    uVar2 = *first[holeIndex_00 * 2 + 2];
    uVar3 = *first[holeIndex_00 * 2 + 1];
    uVar5 = uVar1;
    if (uVar2 == uVar3) {
      uVar5 = uVar4;
    }
    if (first[holeIndex_00 * 2 + 2] <= first[holeIndex_00 * 2 + 1]) {
      uVar5 = uVar1;
    }
    if (uVar2 <= uVar3) {
      uVar4 = uVar5;
    }
    first[holeIndex_00] = first[uVar4];
    holeIndex_00 = uVar4;
  }
  if (((len & 1) == 0) && (holeIndex_00 == len - 2 >> 1)) {
    first[holeIndex_00] = first[holeIndex_00 * 2 + 1];
    holeIndex_00 = holeIndex_00 * 2 + 1;
  }
  intern_push_heap(first,holeIndex_00,holeIndex,value);
  return;
}

Assistant:

static inline void
adjust_heap (uint64_t** first, size_t holeIndex, size_t len, uint64_t* value)
{
    const size_t topIndex    = holeIndex;
    size_t       secondChild = holeIndex;

    while (secondChild < (len - 1) / 2)
    {
        secondChild = 2 * (secondChild + 1);
        if (FHeapCompare (*(first + secondChild), *(first + (secondChild - 1))))
            --secondChild;
        *(first + holeIndex) = *(first + secondChild);
        holeIndex            = secondChild;
    }

    if ((len & 1) == 0 && secondChild == (len - 2) / 2)
    {
        secondChild          = 2 * (secondChild + 1);
        *(first + holeIndex) = *(first + (secondChild - 1));
        holeIndex            = secondChild - 1;
    }

    intern_push_heap (first, holeIndex, topIndex, value);
}